

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Sandwich *sandwich)

{
  ostream *poVar1;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"sandwich {\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(os,"    bread: \"",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(sandwich->bread)._M_dataplus._M_p,(sandwich->bread)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"    condiments: ",0x10);
  StringList::toString_abi_cxx11_(&local_40,&sandwich->condiments);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"    fillings: ",0xe);
  StringList::toString_abi_cxx11_(&local_40,&sandwich->fillings);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Sandwich& sandwich)
{
    os << "sandwich {\n";
    os << "    bread: \"" << sandwich.bread << "\",\n";
    os << "    condiments: " << sandwich.condiments.toString() << ",\n";
    os << "    fillings: " << sandwich.fillings.toString() << "\n";
    os << "}";
    return os;
}